

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O3

string * __thiscall
KMeans::genClusterInitialization(string *__return_storage_ptr__,KMeans *this,string *gridName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  ostream *poVar6;
  long *plVar7;
  istream *piVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong *puVar11;
  size_type *psVar12;
  long *plVar13;
  undefined8 *puVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  string *psVar18;
  ulong uVar19;
  string line;
  string __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string __str_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  initList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ifstream input;
  ulong *local_1550;
  long local_1548;
  ulong local_1540;
  undefined8 uStack_1538;
  string *local_1530;
  ulong *local_1528;
  long local_1520;
  ulong local_1518;
  undefined8 uStack_1510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1508;
  ulong *local_14e8;
  long local_14e0;
  ulong local_14d8;
  long lStack_14d0;
  undefined8 *local_14c8;
  undefined8 local_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  ulong *local_14a8;
  long local_14a0;
  ulong local_1498;
  long lStack_1490;
  ulong *local_1488;
  long local_1480;
  ulong local_1478;
  undefined8 uStack_1470;
  ulong *local_1468;
  long local_1460;
  ulong local_1458;
  undefined8 uStack_1450;
  ulong *local_1448;
  long local_1440;
  ulong local_1438;
  long lStack_1430;
  undefined8 *local_1428;
  undefined8 local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1408;
  ulong *local_13f0;
  long local_13e8;
  ulong local_13e0;
  long lStack_13d8;
  string *local_13d0;
  ulong *local_13c8;
  long local_13c0;
  ulong local_13b8;
  long lStack_13b0;
  ulong *local_13a8;
  long local_13a0;
  ulong local_1398;
  long lStack_1390;
  ulong *local_1388;
  long local_1380;
  ulong local_1378;
  long lStack_1370;
  ulong *local_1368;
  long local_1360;
  ulong local_1358;
  long lStack_1350;
  ulong *local_1348;
  long local_1340;
  ulong local_1338;
  long lStack_1330;
  ulong *local_1328;
  long local_1320;
  ulong local_1318;
  long lStack_1310;
  ulong *local_1308;
  long local_1300;
  ulong local_12f8;
  long lStack_12f0;
  ulong *local_12e8;
  long local_12e0;
  ulong local_12d8;
  long lStack_12d0;
  ulong *local_12c8;
  long local_12c0;
  ulong local_12b8;
  long lStack_12b0;
  ulong *local_12a8;
  long local_12a0;
  ulong local_1298;
  long lStack_1290;
  ulong *local_1288;
  long local_1280;
  ulong local_1278;
  long lStack_1270;
  ulong *local_1268;
  long local_1260;
  ulong local_1258;
  long lStack_1250;
  ulong *local_1248;
  long local_1240;
  ulong local_1238;
  long lStack_1230;
  ulong *local_1228;
  long local_1220;
  ulong local_1218;
  long lStack_1210;
  ulong *local_1208;
  long local_1200;
  ulong local_11f8;
  long lStack_11f0;
  ulong *local_11e8;
  long local_11e0;
  ulong local_11d8;
  long lStack_11d0;
  ulong *local_11c8;
  long local_11c0;
  ulong local_11b8;
  long lStack_11b0;
  ulong *local_11a8;
  long local_11a0;
  ulong local_1198;
  long lStack_1190;
  ulong *local_1188;
  long local_1180;
  ulong local_1178;
  long lStack_1170;
  ulong *local_1168;
  long local_1160;
  ulong local_1158;
  long lStack_1150;
  ulong *local_1148;
  long local_1140;
  ulong local_1138;
  long lStack_1130;
  ulong *local_1128;
  long local_1120;
  ulong local_1118;
  long lStack_1110;
  ulong *local_1108;
  long local_1100;
  ulong local_10f8;
  long lStack_10f0;
  ulong *local_10e8;
  long local_10e0;
  ulong local_10d8;
  long lStack_10d0;
  ulong *local_10c8;
  long local_10c0;
  ulong local_10b8;
  long lStack_10b0;
  ulong *local_10a8;
  long local_10a0;
  ulong local_1098;
  long lStack_1090;
  ulong *local_1088;
  long local_1080;
  ulong local_1078;
  long lStack_1070;
  ulong *local_1068;
  long local_1060;
  ulong local_1058;
  long lStack_1050;
  ulong *local_1048;
  long local_1040;
  ulong local_1038;
  long lStack_1030;
  ulong *local_1028;
  long local_1020;
  ulong local_1018;
  long lStack_1010;
  ulong *local_1008;
  long local_1000;
  ulong local_ff8;
  long lStack_ff0;
  ulong *local_fe8;
  long local_fe0;
  ulong local_fd8;
  long lStack_fd0;
  ulong *local_fc8;
  long local_fc0;
  ulong local_fb8;
  long lStack_fb0;
  ulong *local_fa8;
  long local_fa0;
  ulong local_f98;
  long lStack_f90;
  ulong *local_f88;
  long local_f80;
  ulong local_f78;
  long lStack_f70;
  ulong *local_f68;
  long local_f60;
  ulong local_f58;
  long lStack_f50;
  ulong *local_f48;
  long local_f40;
  ulong local_f38;
  long lStack_f30;
  ulong *local_f28;
  long local_f20;
  ulong local_f18;
  long lStack_f10;
  undefined8 *local_f08;
  undefined8 local_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 *local_ee8;
  undefined8 local_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 *local_ec8;
  undefined8 local_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 *local_ea8;
  undefined8 local_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 *local_e88;
  undefined8 local_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 *local_e68;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 *local_e48;
  undefined8 local_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 *local_e28;
  undefined8 local_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 *local_e08;
  undefined8 local_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 *local_de8;
  undefined8 local_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 *local_dc8;
  undefined8 local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 *local_da8;
  undefined8 local_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 *local_d88;
  undefined8 local_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 *local_d68;
  undefined8 local_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 *local_d48;
  undefined8 local_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 *local_d28;
  undefined8 local_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 *local_d08;
  undefined8 local_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 *local_ce8;
  undefined8 local_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 *local_cc8;
  undefined8 local_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 *local_ca8;
  undefined8 local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 *local_c88;
  undefined8 local_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 *local_c68;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 *local_c48;
  undefined8 local_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 *local_c28;
  undefined8 local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 *local_c08;
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 *local_be8;
  undefined8 local_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 *local_bc8;
  undefined8 local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 *local_ba8;
  undefined8 local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 *local_b88;
  undefined8 local_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 *local_b68;
  undefined8 local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 *local_b48;
  undefined8 local_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 *local_b28;
  undefined8 local_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 *local_b08;
  undefined8 local_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 *local_ae8;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 *local_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa8;
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 *local_a88;
  undefined8 local_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 *local_a68;
  undefined8 local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  ulong *local_a48;
  long local_a40;
  ulong local_a38 [2];
  ulong *local_a28;
  long local_a20;
  ulong local_a18 [2];
  ulong *local_a08;
  long local_a00;
  ulong local_9f8 [2];
  ulong *local_9e8;
  long local_9e0;
  ulong local_9d8 [2];
  ulong *local_9c8;
  long local_9c0;
  ulong local_9b8 [2];
  ulong *local_9a8;
  long local_9a0;
  ulong local_998 [2];
  ulong *local_988;
  long local_980;
  ulong local_978 [2];
  ulong *local_968;
  long local_960;
  ulong local_958 [2];
  ulong *local_948;
  long local_940;
  ulong local_938 [2];
  ulong *local_928;
  long local_920;
  ulong local_918 [2];
  ulong *local_908;
  long local_900;
  ulong local_8f8 [2];
  ulong *local_8e8;
  long local_8e0;
  ulong local_8d8 [2];
  ulong *local_8c8;
  long local_8c0;
  ulong local_8b8 [2];
  ulong *local_8a8;
  long local_8a0;
  ulong local_898 [2];
  ulong *local_888;
  long local_880;
  ulong local_878 [2];
  ulong *local_868;
  long local_860;
  ulong local_858 [2];
  ulong *local_848;
  long local_840;
  ulong local_838 [2];
  ulong *local_828;
  long local_820;
  ulong local_818 [2];
  ulong *local_808;
  long local_800;
  ulong local_7f8 [2];
  ulong *local_7e8;
  long local_7e0;
  ulong local_7d8 [2];
  ulong *local_7c8;
  long local_7c0;
  ulong local_7b8 [2];
  ulong *local_7a8;
  long local_7a0;
  ulong local_798 [2];
  ulong *local_788;
  long local_780;
  ulong local_778 [2];
  ulong *local_768;
  long local_760;
  ulong local_758 [2];
  ulong *local_748;
  long local_740;
  ulong local_738 [2];
  ulong *local_728;
  long local_720;
  ulong local_718 [2];
  ulong *local_708;
  long local_700;
  ulong local_6f8 [2];
  ulong *local_6e8;
  long local_6e0;
  ulong local_6d8 [2];
  ulong *local_6c8;
  long local_6c0;
  ulong local_6b8 [2];
  ulong *local_6a8;
  long local_6a0;
  ulong local_698 [2];
  ulong *local_688;
  long local_680;
  ulong local_678 [2];
  ulong *local_668;
  long local_660;
  ulong local_658 [2];
  ulong *local_648;
  long local_640;
  ulong local_638 [2];
  ulong *local_628;
  long local_620;
  ulong local_618 [2];
  ulong *local_608;
  long local_600;
  ulong local_5f8 [2];
  ulong *local_5e8;
  long local_5e0;
  ulong local_5d8 [2];
  ulong *local_5c8;
  long local_5c0;
  ulong local_5b8 [2];
  ulong *local_5a8;
  long local_5a0;
  ulong local_598 [2];
  ulong *local_588;
  long local_580;
  ulong local_578 [2];
  ulong *local_568;
  long local_560;
  ulong local_558 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  ulong *local_540;
  long local_538;
  ulong local_530 [2];
  ulong *local_520;
  long local_518;
  ulong local_510 [2];
  ulong *local_500;
  long local_4f8;
  ulong local_4f0 [2];
  long *local_4e0;
  long local_4d8;
  long local_4d0;
  long lStack_4c8;
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  char *local_3c0;
  long local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_1408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0 = (char *)&local_3b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,multifaq::dir::PATH_TO_FILES_abi_cxx11_,
             DAT_002d8460 + multifaq::dir::PATH_TO_FILES_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_3c0);
  std::ifstream::ifstream((istream *)local_238,(string *)&local_3c0,_S_in);
  if (local_3c0 != (char *)&local_3b0) {
    operator_delete(local_3c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INFO: Looking for cluster initialization file: ",0x2f);
  local_3c0 = (char *)&local_3b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,multifaq::dir::PATH_TO_FILES_abi_cxx11_,
             DAT_002d8460 + multifaq::dir::PATH_TO_FILES_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_3c0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_3c0,local_3b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_3c0 != (char *)&local_3b0) {
    operator_delete(local_3c0);
  }
  local_1530 = __return_storage_ptr__;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_1550 = &local_1540;
    local_1548 = 0;
    local_1540 = local_1540 & 0xffffffffffffff00;
    local_13d0 = gridName;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_3c0);
    paVar1 = &local_1508.field_2;
    while( true ) {
      cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_1550,cVar5);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      if ((char)*local_1550 != '#') {
        local_1508._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1508,local_1550,(char *)(local_1548 + (long)local_1550));
        std::__cxx11::string::append((char *)&local_1508);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1408,
                   &local_1508);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1508._M_dataplus._M_p != paVar1) {
          operator_delete(local_1508._M_dataplus._M_p);
        }
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_3c0);
    std::ios_base::~ios_base(local_340);
    if (local_1550 != &local_1540) {
      operator_delete(local_1550);
    }
    local_3c0 = (char *)&local_3b0;
    std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x06');
    psVar18 = local_1530;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    local_548 = &psVar18->field_2;
    (psVar18->_M_dataplus)._M_p = (pointer)local_548;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar12) {
      lVar3 = plVar7[3];
      local_548->_M_allocated_capacity = *psVar12;
      *(long *)((long)&psVar18->field_2 + 8) = lVar3;
    }
    else {
      (psVar18->_M_dataplus)._M_p = (pointer)*plVar7;
      (psVar18->field_2)._M_allocated_capacity = *psVar12;
    }
    psVar18->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_3c0 != (char *)&local_3b0) {
      operator_delete(local_3c0);
    }
    uVar10 = (long)local_1408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    uVar17 = this->_k;
    uVar19 = uVar10;
    if (uVar17 < uVar10) {
      uVar19 = uVar17;
    }
    if (uVar19 != 0) {
      uVar19 = 0;
      do {
        local_14c8 = &local_14b8;
        std::__cxx11::string::_M_construct((ulong)&local_14c8,'\x06');
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_14c8);
        puVar11 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar11) {
          local_14d8 = *puVar11;
          lStack_14d0 = puVar9[3];
          local_14e8 = &local_14d8;
        }
        else {
          local_14d8 = *puVar11;
          local_14e8 = (ulong *)*puVar9;
        }
        local_14e0 = puVar9[1];
        *puVar9 = puVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        cVar5 = '\x01';
        if (9 < uVar19) {
          uVar17 = uVar19;
          cVar4 = '\x04';
          do {
            cVar5 = cVar4;
            if (uVar17 < 100) {
              cVar5 = cVar5 + -2;
              goto LAB_001d3d76;
            }
            if (uVar17 < 1000) {
              cVar5 = cVar5 + -1;
              goto LAB_001d3d76;
            }
            if (uVar17 < 10000) goto LAB_001d3d76;
            bVar2 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar4 = cVar5 + '\x04';
          } while (bVar2);
          cVar5 = cVar5 + '\x01';
        }
LAB_001d3d76:
        local_1528 = &local_1518;
        std::__cxx11::string::_M_construct((ulong)&local_1528,cVar5);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1528,(uint)local_1520,uVar19)
        ;
        uVar17 = 0xf;
        if (local_14e8 != &local_14d8) {
          uVar17 = local_14d8;
        }
        if (uVar17 < (ulong)(local_1520 + local_14e0)) {
          uVar17 = 0xf;
          if (local_1528 != &local_1518) {
            uVar17 = local_1518;
          }
          if (uVar17 < (ulong)(local_1520 + local_14e0)) goto LAB_001d3ddd;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1528,0,(char *)0x0,(ulong)local_14e8)
          ;
        }
        else {
LAB_001d3ddd:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_14e8,(ulong)local_1528);
        }
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1508.field_2._M_allocated_capacity = *psVar12;
          local_1508.field_2._8_8_ = puVar9[3];
          local_1508._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1508.field_2._M_allocated_capacity = *psVar12;
          local_1508._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1508._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)psVar12 = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1508);
        local_1550 = &local_1540;
        puVar11 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar11) {
          local_1540 = *puVar11;
          uStack_1538 = puVar9[3];
        }
        else {
          local_1540 = *puVar11;
          local_1550 = (ulong *)*puVar9;
        }
        local_1548 = puVar9[1];
        *puVar9 = puVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1550,
                            (ulong)local_1408.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_dataplus.
                                   _M_p);
        local_3c0 = (char *)&local_3b0;
        pcVar15 = (char *)(puVar9 + 2);
        if ((char *)*puVar9 == pcVar15) {
          local_3b0 = *(undefined8 *)pcVar15;
          uStack_3a8 = puVar9[3];
        }
        else {
          local_3b0 = *(undefined8 *)pcVar15;
          local_3c0 = (char *)*puVar9;
        }
        local_3b8 = puVar9[1];
        *puVar9 = pcVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_1530,(ulong)local_3c0);
        if (local_3c0 != (char *)&local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_1550 != &local_1540) {
          operator_delete(local_1550);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1508._M_dataplus._M_p != paVar1) {
          operator_delete(local_1508._M_dataplus._M_p);
        }
        if (local_1528 != &local_1518) {
          operator_delete(local_1528);
        }
        if (local_14e8 != &local_14d8) {
          operator_delete(local_14e8);
        }
        if (local_14c8 != &local_14b8) {
          operator_delete(local_14c8);
        }
        uVar19 = uVar19 + 1;
        uVar10 = (long)local_1408.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1408.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        uVar17 = this->_k;
        uVar16 = uVar10;
        if (uVar17 < uVar10) {
          uVar16 = uVar17;
        }
      } while (uVar19 < uVar16);
    }
    psVar18 = local_1530;
    if (uVar17 <= uVar10) goto LAB_001d460c;
    local_13f0 = &local_13e0;
    std::__cxx11::string::_M_construct((ulong)&local_13f0,'\x06');
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_13f0);
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_1458 = *puVar11;
      uStack_1450 = puVar9[3];
      local_1468 = &local_1458;
    }
    else {
      local_1458 = *puVar11;
      local_1468 = (ulong *)*puVar9;
    }
    local_1460 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    uVar17 = (long)local_1408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    cVar5 = '\x01';
    if (9 < uVar17) {
      uVar19 = uVar17;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar19 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_001d40d4;
        }
        if (uVar19 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_001d40d4;
        }
        if (uVar19 < 10000) goto LAB_001d40d4;
        bVar2 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar2);
      cVar5 = cVar5 + '\x01';
    }
LAB_001d40d4:
    local_1488 = &local_1478;
    std::__cxx11::string::_M_construct((ulong)&local_1488,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1488,(uint)local_1480,uVar17);
    uVar17 = 0xf;
    if (local_1468 != &local_1458) {
      uVar17 = local_1458;
    }
    if (uVar17 < (ulong)(local_1480 + local_1460)) {
      uVar17 = 0xf;
      if (local_1488 != &local_1478) {
        uVar17 = local_1478;
      }
      if (uVar17 < (ulong)(local_1480 + local_1460)) goto LAB_001d415a;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1488,0,(char *)0x0,(ulong)local_1468);
    }
    else {
LAB_001d415a:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1468,(ulong)local_1488);
    }
    local_1428 = &local_1418;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_1418 = *puVar14;
      uStack_1410 = puVar9[3];
    }
    else {
      local_1418 = *puVar14;
      local_1428 = (undefined8 *)*puVar9;
    }
    local_1420 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1428);
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_1438 = *puVar11;
      lStack_1430 = puVar9[3];
      local_1448 = &local_1438;
    }
    else {
      local_1438 = *puVar11;
      local_1448 = (ulong *)*puVar9;
    }
    local_1440 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_14a8 = &local_1498;
    std::__cxx11::string::_M_construct((ulong)&local_14a8,'\t');
    uVar17 = 0xf;
    if (local_1448 != &local_1438) {
      uVar17 = local_1438;
    }
    if (uVar17 < (ulong)(local_14a0 + local_1440)) {
      uVar17 = 0xf;
      if (local_14a8 != &local_1498) {
        uVar17 = local_1498;
      }
      if (uVar17 < (ulong)(local_14a0 + local_1440)) goto LAB_001d42af;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_14a8,0,(char *)0x0,(ulong)local_1448);
    }
    else {
LAB_001d42af:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1448,(ulong)local_14a8);
    }
    local_1528 = &local_1518;
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_1518 = *puVar11;
      uStack_1510 = puVar9[3];
    }
    else {
      local_1518 = *puVar11;
      local_1528 = (ulong *)*puVar9;
    }
    local_1520 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1528);
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_14b8 = *puVar14;
      uStack_14b0 = puVar9[3];
      local_14c8 = &local_14b8;
    }
    else {
      local_14b8 = *puVar14;
      local_14c8 = (undefined8 *)*puVar9;
    }
    local_14c0 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_14c8,(ulong)(local_13d0->_M_dataplus)._M_p);
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_14d8 = *puVar11;
      lStack_14d0 = puVar9[3];
      local_14e8 = &local_14d8;
    }
    else {
      local_14d8 = *puVar11;
      local_14e8 = (ulong *)*puVar9;
    }
    local_14e0 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_14e8);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1508.field_2._M_allocated_capacity = *psVar12;
      local_1508.field_2._8_8_ = puVar9[3];
      local_1508._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1508.field_2._M_allocated_capacity = *psVar12;
      local_1508._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_1508._M_string_length = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_1508,(ulong)(local_13d0->_M_dataplus)._M_p);
    local_1550 = &local_1540;
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_1540 = *puVar11;
      uStack_1538 = puVar9[3];
    }
    else {
      local_1540 = *puVar11;
      local_1550 = (ulong *)*puVar9;
    }
    local_1548 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1550);
    local_3c0 = (char *)&local_3b0;
    pcVar15 = (char *)(puVar9 + 2);
    if ((char *)*puVar9 == pcVar15) {
      local_3b0 = *(undefined8 *)pcVar15;
      uStack_3a8 = puVar9[3];
    }
    else {
      local_3b0 = *(undefined8 *)pcVar15;
      local_3c0 = (char *)*puVar9;
    }
    local_3b8 = puVar9[1];
    *puVar9 = pcVar15;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_1530,(ulong)local_3c0);
    if (local_3c0 != (char *)&local_3b0) {
      operator_delete(local_3c0);
    }
    if (local_1550 != &local_1540) {
      operator_delete(local_1550);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1508._M_dataplus._M_p != paVar1) {
      operator_delete(local_1508._M_dataplus._M_p);
    }
    if (local_14e8 != &local_14d8) {
      operator_delete(local_14e8);
    }
    if (local_14c8 != &local_14b8) {
      operator_delete(local_14c8);
    }
    if (local_1528 != &local_1518) {
      operator_delete(local_1528);
    }
    if (local_14a8 != &local_1498) {
      operator_delete(local_14a8);
    }
    if (local_1448 != &local_1438) {
      operator_delete(local_1448);
    }
    if (local_1428 != &local_1418) {
      operator_delete(local_1428);
    }
    if (local_1488 != &local_1478) {
      operator_delete(local_1488);
    }
    if (local_1468 != &local_1458) {
      operator_delete(local_1468);
    }
    psVar18 = local_1530;
    if (local_13f0 != &local_13e0) {
      operator_delete(local_13f0);
    }
    goto LAB_001d460c;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INFO: No cluster initialization file provided. \n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INFO: We will use Kmeans++ Initialization instead. \n",0x34);
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct((ulong)local_3e0,'\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)local_3e0);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_13b8 = *puVar11;
    lStack_13b0 = plVar7[3];
    local_13c8 = &local_13b8;
  }
  else {
    local_13b8 = *puVar11;
    local_13c8 = (ulong *)*plVar7;
  }
  local_13c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_568 = local_558;
  std::__cxx11::string::_M_construct((ulong)&local_568,'\x06');
  uVar17 = 0xf;
  if (local_13c8 != &local_13b8) {
    uVar17 = local_13b8;
  }
  if (uVar17 < (ulong)(local_560 + local_13c0)) {
    uVar17 = 0xf;
    if (local_568 != local_558) {
      uVar17 = local_558[0];
    }
    if (uVar17 < (ulong)(local_560 + local_13c0)) goto LAB_001cf3d6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,(ulong)local_13c8);
  }
  else {
LAB_001cf3d6:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_13c8,(ulong)local_568);
  }
  local_f08 = &local_ef8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_ef8 = *puVar14;
    uStack_ef0 = puVar9[3];
  }
  else {
    local_ef8 = *puVar14;
    local_f08 = (undefined8 *)*puVar9;
  }
  local_f00 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_f08);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1398 = *puVar11;
    lStack_1390 = plVar7[3];
    local_13a8 = &local_1398;
  }
  else {
    local_1398 = *puVar11;
    local_13a8 = (ulong *)*plVar7;
  }
  local_13a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_588 = local_578;
  std::__cxx11::string::_M_construct((ulong)&local_588,'\x06');
  uVar17 = 0xf;
  if (local_13a8 != &local_1398) {
    uVar17 = local_1398;
  }
  if (uVar17 < (ulong)(local_580 + local_13a0)) {
    uVar17 = 0xf;
    if (local_588 != local_578) {
      uVar17 = local_578[0];
    }
    if (uVar17 < (ulong)(local_580 + local_13a0)) goto LAB_001cf523;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_588,0,(char *)0x0,(ulong)local_13a8);
  }
  else {
LAB_001cf523:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_13a8,(ulong)local_588);
  }
  local_ee8 = &local_ed8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_ed8 = *puVar14;
    uStack_ed0 = puVar9[3];
  }
  else {
    local_ed8 = *puVar14;
    local_ee8 = (undefined8 *)*puVar9;
  }
  local_ee0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ee8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1378 = *puVar11;
    lStack_1370 = plVar7[3];
    local_1388 = &local_1378;
  }
  else {
    local_1378 = *puVar11;
    local_1388 = (ulong *)*plVar7;
  }
  local_1380 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_5a8 = local_598;
  std::__cxx11::string::_M_construct((ulong)&local_5a8,'\x06');
  uVar17 = 0xf;
  if (local_1388 != &local_1378) {
    uVar17 = local_1378;
  }
  if (uVar17 < (ulong)(local_5a0 + local_1380)) {
    uVar17 = 0xf;
    if (local_5a8 != local_598) {
      uVar17 = local_598[0];
    }
    if (uVar17 < (ulong)(local_5a0 + local_1380)) goto LAB_001cf670;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5a8,0,(char *)0x0,(ulong)local_1388);
  }
  else {
LAB_001cf670:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1388,(ulong)local_5a8);
  }
  local_ec8 = &local_eb8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_eb8 = *puVar14;
    uStack_eb0 = puVar9[3];
  }
  else {
    local_eb8 = *puVar14;
    local_ec8 = (undefined8 *)*puVar9;
  }
  local_ec0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ec8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1358 = *puVar11;
    lStack_1350 = plVar7[3];
    local_1368 = &local_1358;
  }
  else {
    local_1358 = *puVar11;
    local_1368 = (ulong *)*plVar7;
  }
  local_1360 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_5c8 = local_5b8;
  std::__cxx11::string::_M_construct((ulong)&local_5c8,'\x06');
  uVar17 = 0xf;
  if (local_1368 != &local_1358) {
    uVar17 = local_1358;
  }
  if (uVar17 < (ulong)(local_5c0 + local_1360)) {
    uVar17 = 0xf;
    if (local_5c8 != local_5b8) {
      uVar17 = local_5b8[0];
    }
    if (uVar17 < (ulong)(local_5c0 + local_1360)) goto LAB_001cf7bd;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5c8,0,(char *)0x0,(ulong)local_1368);
  }
  else {
LAB_001cf7bd:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1368,(ulong)local_5c8);
  }
  local_ea8 = &local_e98;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_e98 = *puVar14;
    uStack_e90 = puVar9[3];
  }
  else {
    local_e98 = *puVar14;
    local_ea8 = (undefined8 *)*puVar9;
  }
  local_ea0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ea8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1338 = *puVar11;
    lStack_1330 = plVar7[3];
    local_1348 = &local_1338;
  }
  else {
    local_1338 = *puVar11;
    local_1348 = (ulong *)*plVar7;
  }
  local_1340 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_5e8 = local_5d8;
  std::__cxx11::string::_M_construct((ulong)&local_5e8,'\x06');
  uVar17 = 0xf;
  if (local_1348 != &local_1338) {
    uVar17 = local_1338;
  }
  if (uVar17 < (ulong)(local_5e0 + local_1340)) {
    uVar17 = 0xf;
    if (local_5e8 != local_5d8) {
      uVar17 = local_5d8[0];
    }
    if (uVar17 < (ulong)(local_5e0 + local_1340)) goto LAB_001cf90a;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5e8,0,(char *)0x0,(ulong)local_1348);
  }
  else {
LAB_001cf90a:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1348,(ulong)local_5e8);
  }
  local_e88 = &local_e78;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_e78 = *puVar14;
    uStack_e70 = puVar9[3];
  }
  else {
    local_e78 = *puVar14;
    local_e88 = (undefined8 *)*puVar9;
  }
  local_e80 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e88);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1318 = *puVar11;
    lStack_1310 = plVar7[3];
    local_1328 = &local_1318;
  }
  else {
    local_1318 = *puVar11;
    local_1328 = (ulong *)*plVar7;
  }
  local_1320 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_608 = local_5f8;
  std::__cxx11::string::_M_construct((ulong)&local_608,'\x06');
  uVar17 = 0xf;
  if (local_1328 != &local_1318) {
    uVar17 = local_1318;
  }
  if (uVar17 < (ulong)(local_600 + local_1320)) {
    uVar17 = 0xf;
    if (local_608 != local_5f8) {
      uVar17 = local_5f8[0];
    }
    if (uVar17 < (ulong)(local_600 + local_1320)) goto LAB_001cfa57;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_608,0,(char *)0x0,(ulong)local_1328);
  }
  else {
LAB_001cfa57:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1328,(ulong)local_608);
  }
  local_e68 = &local_e58;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_e58 = *puVar14;
    uStack_e50 = puVar9[3];
  }
  else {
    local_e58 = *puVar14;
    local_e68 = (undefined8 *)*puVar9;
  }
  local_e60 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e68);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_12f8 = *puVar11;
    lStack_12f0 = plVar7[3];
    local_1308 = &local_12f8;
  }
  else {
    local_12f8 = *puVar11;
    local_1308 = (ulong *)*plVar7;
  }
  local_1300 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_628 = local_618;
  std::__cxx11::string::_M_construct((ulong)&local_628,'\t');
  uVar17 = 0xf;
  if (local_1308 != &local_12f8) {
    uVar17 = local_12f8;
  }
  if (uVar17 < (ulong)(local_620 + local_1300)) {
    uVar17 = 0xf;
    if (local_628 != local_618) {
      uVar17 = local_618[0];
    }
    if (uVar17 < (ulong)(local_620 + local_1300)) goto LAB_001cfba4;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_628,0,(char *)0x0,(ulong)local_1308);
  }
  else {
LAB_001cfba4:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1308,(ulong)local_628);
  }
  local_e48 = &local_e38;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_e38 = *puVar14;
    uStack_e30 = puVar9[3];
  }
  else {
    local_e38 = *puVar14;
    local_e48 = (undefined8 *)*puVar9;
  }
  local_e40 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e48);
  local_4e0 = &local_4d0;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_4d0 = *plVar13;
    lStack_4c8 = plVar7[3];
  }
  else {
    local_4d0 = *plVar13;
    local_4e0 = (long *)*plVar7;
  }
  local_4d8 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4e0,(ulong)(gridName->_M_dataplus)._M_p);
  local_4c0 = &local_4b0;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_4b0 = *plVar13;
    lStack_4a8 = plVar7[3];
  }
  else {
    local_4b0 = *plVar13;
    local_4c0 = (long *)*plVar7;
  }
  local_4b8 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_12d8 = *puVar11;
    lStack_12d0 = plVar7[3];
    local_12e8 = &local_12d8;
  }
  else {
    local_12d8 = *puVar11;
    local_12e8 = (ulong *)*plVar7;
  }
  local_12e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_648 = local_638;
  std::__cxx11::string::_M_construct((ulong)&local_648,'\t');
  uVar17 = 0xf;
  if (local_12e8 != &local_12d8) {
    uVar17 = local_12d8;
  }
  if (uVar17 < (ulong)(local_640 + local_12e0)) {
    uVar17 = 0xf;
    if (local_648 != local_638) {
      uVar17 = local_638[0];
    }
    if (uVar17 < (ulong)(local_640 + local_12e0)) goto LAB_001cfdb4;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_648,0,(char *)0x0,(ulong)local_12e8);
  }
  else {
LAB_001cfdb4:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_12e8,(ulong)local_648);
  }
  local_e28 = &local_e18;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_e18 = *puVar14;
    uStack_e10 = puVar9[3];
  }
  else {
    local_e18 = *puVar14;
    local_e28 = (undefined8 *)*puVar9;
  }
  local_e20 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e28);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_12b8 = *puVar11;
    lStack_12b0 = plVar7[3];
    local_12c8 = &local_12b8;
  }
  else {
    local_12b8 = *puVar11;
    local_12c8 = (ulong *)*plVar7;
  }
  local_12c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_668 = local_658;
  std::__cxx11::string::_M_construct((ulong)&local_668,'\x06');
  uVar17 = 0xf;
  if (local_12c8 != &local_12b8) {
    uVar17 = local_12b8;
  }
  if (uVar17 < (ulong)(local_660 + local_12c0)) {
    uVar17 = 0xf;
    if (local_668 != local_658) {
      uVar17 = local_658[0];
    }
    if (uVar17 < (ulong)(local_660 + local_12c0)) goto LAB_001cff01;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_668,0,(char *)0x0,(ulong)local_12c8);
  }
  else {
LAB_001cff01:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_12c8,(ulong)local_668);
  }
  local_e08 = &local_df8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_df8 = *puVar14;
    uStack_df0 = puVar9[3];
  }
  else {
    local_df8 = *puVar14;
    local_e08 = (undefined8 *)*puVar9;
  }
  local_e00 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e08);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1298 = *puVar11;
    lStack_1290 = plVar7[3];
    local_12a8 = &local_1298;
  }
  else {
    local_1298 = *puVar11;
    local_12a8 = (ulong *)*plVar7;
  }
  local_12a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_688 = local_678;
  std::__cxx11::string::_M_construct((ulong)&local_688,'\x06');
  uVar17 = 0xf;
  if (local_12a8 != &local_1298) {
    uVar17 = local_1298;
  }
  if (uVar17 < (ulong)(local_680 + local_12a0)) {
    uVar17 = 0xf;
    if (local_688 != local_678) {
      uVar17 = local_678[0];
    }
    if (uVar17 < (ulong)(local_680 + local_12a0)) goto LAB_001d004e;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_688,0,(char *)0x0,(ulong)local_12a8);
  }
  else {
LAB_001d004e:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_12a8,(ulong)local_688);
  }
  local_de8 = &local_dd8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_dd8 = *puVar14;
    uStack_dd0 = puVar9[3];
  }
  else {
    local_dd8 = *puVar14;
    local_de8 = (undefined8 *)*puVar9;
  }
  local_de0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_de8);
  local_4a0 = &local_490;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_490 = *plVar13;
    lStack_488 = plVar7[3];
  }
  else {
    local_490 = *plVar13;
    local_4a0 = (long *)*plVar7;
  }
  local_498 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4a0,(ulong)(gridName->_M_dataplus)._M_p);
  local_480 = &local_470;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_470 = *plVar13;
    lStack_468 = plVar7[3];
  }
  else {
    local_470 = *plVar13;
    local_480 = (long *)*plVar7;
  }
  local_478 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_480);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1278 = *puVar11;
    lStack_1270 = plVar7[3];
    local_1288 = &local_1278;
  }
  else {
    local_1278 = *puVar11;
    local_1288 = (ulong *)*plVar7;
  }
  local_1280 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_6a8 = local_698;
  std::__cxx11::string::_M_construct((ulong)&local_6a8,'\x06');
  uVar17 = 0xf;
  if (local_1288 != &local_1278) {
    uVar17 = local_1278;
  }
  if (uVar17 < (ulong)(local_6a0 + local_1280)) {
    uVar17 = 0xf;
    if (local_6a8 != local_698) {
      uVar17 = local_698[0];
    }
    if (uVar17 < (ulong)(local_6a0 + local_1280)) goto LAB_001d025e;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6a8,0,(char *)0x0,(ulong)local_1288);
  }
  else {
LAB_001d025e:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1288,(ulong)local_6a8);
  }
  local_dc8 = &local_db8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_db8 = *puVar14;
    uStack_db0 = puVar9[3];
  }
  else {
    local_db8 = *puVar14;
    local_dc8 = (undefined8 *)*puVar9;
  }
  local_dc0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_dc8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1258 = *puVar11;
    lStack_1250 = plVar7[3];
    local_1268 = &local_1258;
  }
  else {
    local_1258 = *puVar11;
    local_1268 = (ulong *)*plVar7;
  }
  local_1260 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_6c8 = local_6b8;
  std::__cxx11::string::_M_construct((ulong)&local_6c8,'\x06');
  uVar17 = 0xf;
  if (local_1268 != &local_1258) {
    uVar17 = local_1258;
  }
  if (uVar17 < (ulong)(local_6c0 + local_1260)) {
    uVar17 = 0xf;
    if (local_6c8 != local_6b8) {
      uVar17 = local_6b8[0];
    }
    if (uVar17 < (ulong)(local_6c0 + local_1260)) goto LAB_001d03ab;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6c8,0,(char *)0x0,(ulong)local_1268);
  }
  else {
LAB_001d03ab:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1268,(ulong)local_6c8);
  }
  local_da8 = &local_d98;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_d98 = *puVar14;
    uStack_d90 = puVar9[3];
  }
  else {
    local_d98 = *puVar14;
    local_da8 = (undefined8 *)*puVar9;
  }
  local_da0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_da8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1238 = *puVar11;
    lStack_1230 = plVar7[3];
    local_1248 = &local_1238;
  }
  else {
    local_1238 = *puVar11;
    local_1248 = (ulong *)*plVar7;
  }
  local_1240 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_6e8 = local_6d8;
  std::__cxx11::string::_M_construct((ulong)&local_6e8,'\x06');
  uVar17 = 0xf;
  if (local_1248 != &local_1238) {
    uVar17 = local_1238;
  }
  if (uVar17 < (ulong)(local_6e0 + local_1240)) {
    uVar17 = 0xf;
    if (local_6e8 != local_6d8) {
      uVar17 = local_6d8[0];
    }
    if (uVar17 < (ulong)(local_6e0 + local_1240)) goto LAB_001d04f8;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6e8,0,(char *)0x0,(ulong)local_1248);
  }
  else {
LAB_001d04f8:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1248,(ulong)local_6e8);
  }
  local_d88 = &local_d78;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_d78 = *puVar14;
    uStack_d70 = puVar9[3];
  }
  else {
    local_d78 = *puVar14;
    local_d88 = (undefined8 *)*puVar9;
  }
  local_d80 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d88);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1218 = *puVar11;
    lStack_1210 = plVar7[3];
    local_1228 = &local_1218;
  }
  else {
    local_1218 = *puVar11;
    local_1228 = (ulong *)*plVar7;
  }
  local_1220 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_708 = local_6f8;
  std::__cxx11::string::_M_construct((ulong)&local_708,'\t');
  uVar17 = 0xf;
  if (local_1228 != &local_1218) {
    uVar17 = local_1218;
  }
  if (uVar17 < (ulong)(local_700 + local_1220)) {
    uVar17 = 0xf;
    if (local_708 != local_6f8) {
      uVar17 = local_6f8[0];
    }
    if (uVar17 < (ulong)(local_700 + local_1220)) goto LAB_001d0645;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_708,0,(char *)0x0,(ulong)local_1228);
  }
  else {
LAB_001d0645:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1228,(ulong)local_708);
  }
  local_d68 = &local_d58;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_d58 = *puVar14;
    uStack_d50 = puVar9[3];
  }
  else {
    local_d58 = *puVar14;
    local_d68 = (undefined8 *)*puVar9;
  }
  local_d60 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d68);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_11f8 = *puVar11;
    lStack_11f0 = plVar7[3];
    local_1208 = &local_11f8;
  }
  else {
    local_11f8 = *puVar11;
    local_1208 = (ulong *)*plVar7;
  }
  local_1200 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_728 = local_718;
  std::__cxx11::string::_M_construct((ulong)&local_728,'\t');
  uVar17 = 0xf;
  if (local_1208 != &local_11f8) {
    uVar17 = local_11f8;
  }
  if (uVar17 < (ulong)(local_720 + local_1200)) {
    uVar17 = 0xf;
    if (local_728 != local_718) {
      uVar17 = local_718[0];
    }
    if (uVar17 < (ulong)(local_720 + local_1200)) goto LAB_001d0792;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_728,0,(char *)0x0,(ulong)local_1208);
  }
  else {
LAB_001d0792:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1208,(ulong)local_728);
  }
  local_d48 = &local_d38;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_d38 = *puVar14;
    uStack_d30 = puVar9[3];
  }
  else {
    local_d38 = *puVar14;
    local_d48 = (undefined8 *)*puVar9;
  }
  local_d40 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d48);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_11d8 = *puVar11;
    lStack_11d0 = plVar7[3];
    local_11e8 = &local_11d8;
  }
  else {
    local_11d8 = *puVar11;
    local_11e8 = (ulong *)*plVar7;
  }
  local_11e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_748 = local_738;
  std::__cxx11::string::_M_construct((ulong)&local_748,'\t');
  uVar17 = 0xf;
  if (local_11e8 != &local_11d8) {
    uVar17 = local_11d8;
  }
  if (uVar17 < (ulong)(local_740 + local_11e0)) {
    uVar17 = 0xf;
    if (local_748 != local_738) {
      uVar17 = local_738[0];
    }
    if (uVar17 < (ulong)(local_740 + local_11e0)) goto LAB_001d08df;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_748,0,(char *)0x0,(ulong)local_11e8);
  }
  else {
LAB_001d08df:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_11e8,(ulong)local_748);
  }
  local_d28 = &local_d18;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_d18 = *puVar14;
    uStack_d10 = puVar9[3];
  }
  else {
    local_d18 = *puVar14;
    local_d28 = (undefined8 *)*puVar9;
  }
  local_d20 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d28);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_11b8 = *puVar11;
    lStack_11b0 = plVar7[3];
    local_11c8 = &local_11b8;
  }
  else {
    local_11b8 = *puVar11;
    local_11c8 = (ulong *)*plVar7;
  }
  local_11c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_768 = local_758;
  std::__cxx11::string::_M_construct((ulong)&local_768,'\t');
  uVar17 = 0xf;
  if (local_11c8 != &local_11b8) {
    uVar17 = local_11b8;
  }
  if (uVar17 < (ulong)(local_760 + local_11c0)) {
    uVar17 = 0xf;
    if (local_768 != local_758) {
      uVar17 = local_758[0];
    }
    if (uVar17 < (ulong)(local_760 + local_11c0)) goto LAB_001d0a2c;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_768,0,(char *)0x0,(ulong)local_11c8);
  }
  else {
LAB_001d0a2c:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_11c8,(ulong)local_768);
  }
  local_d08 = &local_cf8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_cf8 = *puVar14;
    uStack_cf0 = puVar9[3];
  }
  else {
    local_cf8 = *puVar14;
    local_d08 = (undefined8 *)*puVar9;
  }
  local_d00 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d08);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1198 = *puVar11;
    lStack_1190 = plVar7[3];
    local_11a8 = &local_1198;
  }
  else {
    local_1198 = *puVar11;
    local_11a8 = (ulong *)*plVar7;
  }
  local_11a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_788 = local_778;
  std::__cxx11::string::_M_construct((ulong)&local_788,'\t');
  uVar17 = 0xf;
  if (local_11a8 != &local_1198) {
    uVar17 = local_1198;
  }
  if (uVar17 < (ulong)(local_780 + local_11a0)) {
    uVar17 = 0xf;
    if (local_788 != local_778) {
      uVar17 = local_778[0];
    }
    if (uVar17 < (ulong)(local_780 + local_11a0)) goto LAB_001d0b79;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,(ulong)local_11a8);
  }
  else {
LAB_001d0b79:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_11a8,(ulong)local_788);
  }
  local_ce8 = &local_cd8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_cd8 = *puVar14;
    uStack_cd0 = puVar9[3];
  }
  else {
    local_cd8 = *puVar14;
    local_ce8 = (undefined8 *)*puVar9;
  }
  local_ce0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ce8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1178 = *puVar11;
    lStack_1170 = plVar7[3];
    local_1188 = &local_1178;
  }
  else {
    local_1178 = *puVar11;
    local_1188 = (ulong *)*plVar7;
  }
  local_1180 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_7a8 = local_798;
  std::__cxx11::string::_M_construct((ulong)&local_7a8,'\f');
  uVar17 = 0xf;
  if (local_1188 != &local_1178) {
    uVar17 = local_1178;
  }
  if (uVar17 < (ulong)(local_7a0 + local_1180)) {
    uVar17 = 0xf;
    if (local_7a8 != local_798) {
      uVar17 = local_798[0];
    }
    if (uVar17 < (ulong)(local_7a0 + local_1180)) goto LAB_001d0cc6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7a8,0,(char *)0x0,(ulong)local_1188);
  }
  else {
LAB_001d0cc6:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1188,(ulong)local_7a8);
  }
  local_cc8 = &local_cb8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_cb8 = *puVar14;
    uStack_cb0 = puVar9[3];
  }
  else {
    local_cb8 = *puVar14;
    local_cc8 = (undefined8 *)*puVar9;
  }
  local_cc0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_cc8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1158 = *puVar11;
    lStack_1150 = plVar7[3];
    local_1168 = &local_1158;
  }
  else {
    local_1158 = *puVar11;
    local_1168 = (ulong *)*plVar7;
  }
  local_1160 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_7c8 = local_7b8;
  std::__cxx11::string::_M_construct((ulong)&local_7c8,'\f');
  uVar17 = 0xf;
  if (local_1168 != &local_1158) {
    uVar17 = local_1158;
  }
  if (uVar17 < (ulong)(local_7c0 + local_1160)) {
    uVar17 = 0xf;
    if (local_7c8 != local_7b8) {
      uVar17 = local_7b8[0];
    }
    if (uVar17 < (ulong)(local_7c0 + local_1160)) goto LAB_001d0e13;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7c8,0,(char *)0x0,(ulong)local_1168);
  }
  else {
LAB_001d0e13:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1168,(ulong)local_7c8);
  }
  local_ca8 = &local_c98;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_c98 = *puVar14;
    uStack_c90 = puVar9[3];
  }
  else {
    local_c98 = *puVar14;
    local_ca8 = (undefined8 *)*puVar9;
  }
  local_ca0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ca8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1138 = *puVar11;
    lStack_1130 = plVar7[3];
    local_1148 = &local_1138;
  }
  else {
    local_1138 = *puVar11;
    local_1148 = (ulong *)*plVar7;
  }
  local_1140 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_7e8 = local_7d8;
  std::__cxx11::string::_M_construct((ulong)&local_7e8,'\f');
  uVar17 = 0xf;
  if (local_1148 != &local_1138) {
    uVar17 = local_1138;
  }
  if (uVar17 < (ulong)(local_7e0 + local_1140)) {
    uVar17 = 0xf;
    if (local_7e8 != local_7d8) {
      uVar17 = local_7d8[0];
    }
    if (uVar17 < (ulong)(local_7e0 + local_1140)) goto LAB_001d0f60;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7e8,0,(char *)0x0,(ulong)local_1148);
  }
  else {
LAB_001d0f60:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1148,(ulong)local_7e8);
  }
  local_c88 = &local_c78;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_c78 = *puVar14;
    uStack_c70 = puVar9[3];
  }
  else {
    local_c78 = *puVar14;
    local_c88 = (undefined8 *)*puVar9;
  }
  local_c80 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c88);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1118 = *puVar11;
    lStack_1110 = plVar7[3];
    local_1128 = &local_1118;
  }
  else {
    local_1118 = *puVar11;
    local_1128 = (ulong *)*plVar7;
  }
  local_1120 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_808 = local_7f8;
  std::__cxx11::string::_M_construct((ulong)&local_808,'\x0f');
  uVar17 = 0xf;
  if (local_1128 != &local_1118) {
    uVar17 = local_1118;
  }
  if (uVar17 < (ulong)(local_800 + local_1120)) {
    uVar17 = 0xf;
    if (local_808 != local_7f8) {
      uVar17 = local_7f8[0];
    }
    if (uVar17 < (ulong)(local_800 + local_1120)) goto LAB_001d10ae;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_808,0,(char *)0x0,(ulong)local_1128);
  }
  else {
LAB_001d10ae:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1128,(ulong)local_808);
  }
  local_c68 = &local_c58;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_c58 = *puVar14;
    uStack_c50 = puVar9[3];
  }
  else {
    local_c58 = *puVar14;
    local_c68 = (undefined8 *)*puVar9;
  }
  local_c60 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c68);
  local_460 = &local_450;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_450 = *plVar13;
    lStack_448 = plVar7[3];
  }
  else {
    local_450 = *plVar13;
    local_460 = (long *)*plVar7;
  }
  local_458 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_460,(ulong)(gridName->_M_dataplus)._M_p);
  local_440 = &local_430;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_430 = *plVar13;
    lStack_428 = plVar7[3];
  }
  else {
    local_430 = *plVar13;
    local_440 = (long *)*plVar7;
  }
  local_438 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_440);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_10f8 = *puVar11;
    lStack_10f0 = plVar7[3];
    local_1108 = &local_10f8;
  }
  else {
    local_10f8 = *puVar11;
    local_1108 = (ulong *)*plVar7;
  }
  local_1100 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_828 = local_818;
  std::__cxx11::string::_M_construct((ulong)&local_828,'\x0f');
  uVar17 = 0xf;
  if (local_1108 != &local_10f8) {
    uVar17 = local_10f8;
  }
  if (uVar17 < (ulong)(local_820 + local_1100)) {
    uVar17 = 0xf;
    if (local_828 != local_818) {
      uVar17 = local_818[0];
    }
    if (uVar17 < (ulong)(local_820 + local_1100)) goto LAB_001d12bf;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_828,0,(char *)0x0,(ulong)local_1108);
  }
  else {
LAB_001d12bf:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1108,(ulong)local_828);
  }
  local_c48 = &local_c38;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_c38 = *puVar14;
    uStack_c30 = puVar9[3];
  }
  else {
    local_c38 = *puVar14;
    local_c48 = (undefined8 *)*puVar9;
  }
  local_c40 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c48);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_10d8 = *puVar11;
    lStack_10d0 = plVar7[3];
    local_10e8 = &local_10d8;
  }
  else {
    local_10d8 = *puVar11;
    local_10e8 = (ulong *)*plVar7;
  }
  local_10e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_848 = local_838;
  std::__cxx11::string::_M_construct((ulong)&local_848,'\f');
  uVar17 = 0xf;
  if (local_10e8 != &local_10d8) {
    uVar17 = local_10d8;
  }
  if (uVar17 < (ulong)(local_840 + local_10e0)) {
    uVar17 = 0xf;
    if (local_848 != local_838) {
      uVar17 = local_838[0];
    }
    if (uVar17 < (ulong)(local_840 + local_10e0)) goto LAB_001d140c;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_848,0,(char *)0x0,(ulong)local_10e8);
  }
  else {
LAB_001d140c:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_10e8,(ulong)local_848);
  }
  local_c28 = &local_c18;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_c18 = *puVar14;
    uStack_c10 = puVar9[3];
  }
  else {
    local_c18 = *puVar14;
    local_c28 = (undefined8 *)*puVar9;
  }
  local_c20 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c28);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_10b8 = *puVar11;
    lStack_10b0 = plVar7[3];
    local_10c8 = &local_10b8;
  }
  else {
    local_10b8 = *puVar11;
    local_10c8 = (ulong *)*plVar7;
  }
  local_10c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_868 = local_858;
  std::__cxx11::string::_M_construct((ulong)&local_868,'\f');
  uVar17 = 0xf;
  if (local_10c8 != &local_10b8) {
    uVar17 = local_10b8;
  }
  if (uVar17 < (ulong)(local_860 + local_10c0)) {
    uVar17 = 0xf;
    if (local_868 != local_858) {
      uVar17 = local_858[0];
    }
    if (uVar17 < (ulong)(local_860 + local_10c0)) goto LAB_001d1559;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_868,0,(char *)0x0,(ulong)local_10c8);
  }
  else {
LAB_001d1559:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_10c8,(ulong)local_868);
  }
  local_c08 = &local_bf8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_bf8 = *puVar14;
    uStack_bf0 = puVar9[3];
  }
  else {
    local_bf8 = *puVar14;
    local_c08 = (undefined8 *)*puVar9;
  }
  local_c00 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c08);
  local_420 = &local_410;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_410 = *plVar13;
    lStack_408 = plVar7[3];
  }
  else {
    local_410 = *plVar13;
    local_420 = (long *)*plVar7;
  }
  local_418 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_420,(ulong)(gridName->_M_dataplus)._M_p);
  local_400 = &local_3f0;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_3f0 = *plVar13;
    lStack_3e8 = plVar7[3];
  }
  else {
    local_3f0 = *plVar13;
    local_400 = (long *)*plVar7;
  }
  local_3f8 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_400);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1098 = *puVar11;
    lStack_1090 = plVar7[3];
    local_10a8 = &local_1098;
  }
  else {
    local_1098 = *puVar11;
    local_10a8 = (ulong *)*plVar7;
  }
  local_10a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_888 = local_878;
  std::__cxx11::string::_M_construct((ulong)&local_888,'\f');
  uVar17 = 0xf;
  if (local_10a8 != &local_1098) {
    uVar17 = local_1098;
  }
  if (uVar17 < (ulong)(local_880 + local_10a0)) {
    uVar17 = 0xf;
    if (local_888 != local_878) {
      uVar17 = local_878[0];
    }
    if (uVar17 < (ulong)(local_880 + local_10a0)) goto LAB_001d1769;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_888,0,(char *)0x0,(ulong)local_10a8);
  }
  else {
LAB_001d1769:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_10a8,(ulong)local_888);
  }
  local_be8 = &local_bd8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_bd8 = *puVar14;
    uStack_bd0 = puVar9[3];
  }
  else {
    local_bd8 = *puVar14;
    local_be8 = (undefined8 *)*puVar9;
  }
  local_be0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_be8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1078 = *puVar11;
    lStack_1070 = plVar7[3];
    local_1088 = &local_1078;
  }
  else {
    local_1078 = *puVar11;
    local_1088 = (ulong *)*plVar7;
  }
  local_1080 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_8a8 = local_898;
  std::__cxx11::string::_M_construct((ulong)&local_8a8,'\f');
  uVar17 = 0xf;
  if (local_1088 != &local_1078) {
    uVar17 = local_1078;
  }
  if (uVar17 < (ulong)(local_8a0 + local_1080)) {
    uVar17 = 0xf;
    if (local_8a8 != local_898) {
      uVar17 = local_898[0];
    }
    if (uVar17 < (ulong)(local_8a0 + local_1080)) goto LAB_001d18b6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8a8,0,(char *)0x0,(ulong)local_1088);
  }
  else {
LAB_001d18b6:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1088,(ulong)local_8a8);
  }
  local_bc8 = &local_bb8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_bb8 = *puVar14;
    uStack_bb0 = puVar9[3];
  }
  else {
    local_bb8 = *puVar14;
    local_bc8 = (undefined8 *)*puVar9;
  }
  local_bc0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_bc8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1058 = *puVar11;
    lStack_1050 = plVar7[3];
    local_1068 = &local_1058;
  }
  else {
    local_1058 = *puVar11;
    local_1068 = (ulong *)*plVar7;
  }
  local_1060 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_8c8 = local_8b8;
  std::__cxx11::string::_M_construct((ulong)&local_8c8,'\t');
  uVar17 = 0xf;
  if (local_1068 != &local_1058) {
    uVar17 = local_1058;
  }
  if (uVar17 < (ulong)(local_8c0 + local_1060)) {
    uVar17 = 0xf;
    if (local_8c8 != local_8b8) {
      uVar17 = local_8b8[0];
    }
    if (uVar17 < (ulong)(local_8c0 + local_1060)) goto LAB_001d1a03;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8c8,0,(char *)0x0,(ulong)local_1068);
  }
  else {
LAB_001d1a03:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1068,(ulong)local_8c8);
  }
  local_ba8 = &local_b98;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_b98 = *puVar14;
    uStack_b90 = puVar9[3];
  }
  else {
    local_b98 = *puVar14;
    local_ba8 = (undefined8 *)*puVar9;
  }
  local_ba0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ba8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1038 = *puVar11;
    lStack_1030 = plVar7[3];
    local_1048 = &local_1038;
  }
  else {
    local_1038 = *puVar11;
    local_1048 = (ulong *)*plVar7;
  }
  local_1040 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_8e8 = local_8d8;
  std::__cxx11::string::_M_construct((ulong)&local_8e8,'\t');
  uVar17 = 0xf;
  if (local_1048 != &local_1038) {
    uVar17 = local_1038;
  }
  if (uVar17 < (ulong)(local_8e0 + local_1040)) {
    uVar17 = 0xf;
    if (local_8e8 != local_8d8) {
      uVar17 = local_8d8[0];
    }
    if (uVar17 < (ulong)(local_8e0 + local_1040)) goto LAB_001d1b50;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8e8,0,(char *)0x0,(ulong)local_1048);
  }
  else {
LAB_001d1b50:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1048,(ulong)local_8e8);
  }
  local_b88 = &local_b78;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_b78 = *puVar14;
    uStack_b70 = puVar9[3];
  }
  else {
    local_b78 = *puVar14;
    local_b88 = (undefined8 *)*puVar9;
  }
  local_b80 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b88);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1018 = *puVar11;
    lStack_1010 = plVar7[3];
    local_1028 = &local_1018;
  }
  else {
    local_1018 = *puVar11;
    local_1028 = (ulong *)*plVar7;
  }
  local_1020 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_908 = local_8f8;
  std::__cxx11::string::_M_construct((ulong)&local_908,'\t');
  uVar17 = 0xf;
  if (local_1028 != &local_1018) {
    uVar17 = local_1018;
  }
  if (uVar17 < (ulong)(local_900 + local_1020)) {
    uVar17 = 0xf;
    if (local_908 != local_8f8) {
      uVar17 = local_8f8[0];
    }
    if (uVar17 < (ulong)(local_900 + local_1020)) goto LAB_001d1c9d;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_908,0,(char *)0x0,(ulong)local_1028);
  }
  else {
LAB_001d1c9d:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1028,(ulong)local_908);
  }
  local_b68 = &local_b58;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_b58 = *puVar14;
    uStack_b50 = puVar9[3];
  }
  else {
    local_b58 = *puVar14;
    local_b68 = (undefined8 *)*puVar9;
  }
  local_b60 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b68);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_ff8 = *puVar11;
    lStack_ff0 = plVar7[3];
    local_1008 = &local_ff8;
  }
  else {
    local_ff8 = *puVar11;
    local_1008 = (ulong *)*plVar7;
  }
  local_1000 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_928 = local_918;
  std::__cxx11::string::_M_construct((ulong)&local_928,'\t');
  uVar17 = 0xf;
  if (local_1008 != &local_ff8) {
    uVar17 = local_ff8;
  }
  if (uVar17 < (ulong)(local_920 + local_1000)) {
    uVar17 = 0xf;
    if (local_928 != local_918) {
      uVar17 = local_918[0];
    }
    if (uVar17 < (ulong)(local_920 + local_1000)) goto LAB_001d1dea;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_928,0,(char *)0x0,(ulong)local_1008);
  }
  else {
LAB_001d1dea:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1008,(ulong)local_928);
  }
  local_b48 = &local_b38;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_b38 = *puVar14;
    uStack_b30 = puVar9[3];
  }
  else {
    local_b38 = *puVar14;
    local_b48 = (undefined8 *)*puVar9;
  }
  local_b40 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b48);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_fd8 = *puVar11;
    lStack_fd0 = plVar7[3];
    local_fe8 = &local_fd8;
  }
  else {
    local_fd8 = *puVar11;
    local_fe8 = (ulong *)*plVar7;
  }
  local_fe0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_948 = local_938;
  std::__cxx11::string::_M_construct((ulong)&local_948,'\f');
  uVar17 = 0xf;
  if (local_fe8 != &local_fd8) {
    uVar17 = local_fd8;
  }
  if (uVar17 < (ulong)(local_940 + local_fe0)) {
    uVar17 = 0xf;
    if (local_948 != local_938) {
      uVar17 = local_938[0];
    }
    if (uVar17 < (ulong)(local_940 + local_fe0)) goto LAB_001d1f37;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_948,0,(char *)0x0,(ulong)local_fe8);
  }
  else {
LAB_001d1f37:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_fe8,(ulong)local_948);
  }
  local_b28 = &local_b18;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_b18 = *puVar14;
    uStack_b10 = puVar9[3];
  }
  else {
    local_b18 = *puVar14;
    local_b28 = (undefined8 *)*puVar9;
  }
  local_b20 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b28);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_fb8 = *puVar11;
    lStack_fb0 = plVar7[3];
    local_fc8 = &local_fb8;
  }
  else {
    local_fb8 = *puVar11;
    local_fc8 = (ulong *)*plVar7;
  }
  local_fc0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_968 = local_958;
  std::__cxx11::string::_M_construct((ulong)&local_968,'\f');
  uVar17 = 0xf;
  if (local_fc8 != &local_fb8) {
    uVar17 = local_fb8;
  }
  if (uVar17 < (ulong)(local_960 + local_fc0)) {
    uVar17 = 0xf;
    if (local_968 != local_958) {
      uVar17 = local_958[0];
    }
    if (uVar17 < (ulong)(local_960 + local_fc0)) goto LAB_001d2084;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_968,0,(char *)0x0,(ulong)local_fc8);
  }
  else {
LAB_001d2084:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_fc8,(ulong)local_968);
  }
  local_b08 = &local_af8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_af8 = *puVar14;
    uStack_af0 = puVar9[3];
  }
  else {
    local_af8 = *puVar14;
    local_b08 = (undefined8 *)*puVar9;
  }
  local_b00 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b08);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f98 = *puVar11;
    lStack_f90 = plVar7[3];
    local_fa8 = &local_f98;
  }
  else {
    local_f98 = *puVar11;
    local_fa8 = (ulong *)*plVar7;
  }
  local_fa0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_988 = local_978;
  std::__cxx11::string::_M_construct((ulong)&local_988,'\t');
  uVar17 = 0xf;
  if (local_fa8 != &local_f98) {
    uVar17 = local_f98;
  }
  if (uVar17 < (ulong)(local_980 + local_fa0)) {
    uVar17 = 0xf;
    if (local_988 != local_978) {
      uVar17 = local_978[0];
    }
    if (uVar17 < (ulong)(local_980 + local_fa0)) goto LAB_001d21d1;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_988,0,(char *)0x0,(ulong)local_fa8);
  }
  else {
LAB_001d21d1:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_fa8,(ulong)local_988);
  }
  local_ae8 = &local_ad8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_ad8 = *puVar14;
    uStack_ad0 = puVar9[3];
  }
  else {
    local_ad8 = *puVar14;
    local_ae8 = (undefined8 *)*puVar9;
  }
  local_ae0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ae8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f78 = *puVar11;
    lStack_f70 = plVar7[3];
    local_f88 = &local_f78;
  }
  else {
    local_f78 = *puVar11;
    local_f88 = (ulong *)*plVar7;
  }
  local_f80 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_9a8 = local_998;
  std::__cxx11::string::_M_construct((ulong)&local_9a8,'\t');
  uVar17 = 0xf;
  if (local_f88 != &local_f78) {
    uVar17 = local_f78;
  }
  if (uVar17 < (ulong)(local_9a0 + local_f80)) {
    uVar17 = 0xf;
    if (local_9a8 != local_998) {
      uVar17 = local_998[0];
    }
    if (uVar17 < (ulong)(local_9a0 + local_f80)) goto LAB_001d231e;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9a8,0,(char *)0x0,(ulong)local_f88);
  }
  else {
LAB_001d231e:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f88,(ulong)local_9a8);
  }
  local_ac8 = &local_ab8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_ab8 = *puVar14;
    uStack_ab0 = puVar9[3];
  }
  else {
    local_ab8 = *puVar14;
    local_ac8 = (undefined8 *)*puVar9;
  }
  local_ac0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ac8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f58 = *puVar11;
    lStack_f50 = plVar7[3];
    local_f68 = &local_f58;
  }
  else {
    local_f58 = *puVar11;
    local_f68 = (ulong *)*plVar7;
  }
  local_f60 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_9c8 = local_9b8;
  std::__cxx11::string::_M_construct((ulong)&local_9c8,'\t');
  uVar17 = 0xf;
  if (local_f68 != &local_f58) {
    uVar17 = local_f58;
  }
  if (uVar17 < (ulong)(local_9c0 + local_f60)) {
    uVar17 = 0xf;
    if (local_9c8 != local_9b8) {
      uVar17 = local_9b8[0];
    }
    if (uVar17 < (ulong)(local_9c0 + local_f60)) goto LAB_001d246b;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9c8,0,(char *)0x0,(ulong)local_f68);
  }
  else {
LAB_001d246b:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f68,(ulong)local_9c8);
  }
  local_aa8 = &local_a98;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_a98 = *puVar14;
    uStack_a90 = puVar9[3];
  }
  else {
    local_a98 = *puVar14;
    local_aa8 = (undefined8 *)*puVar9;
  }
  local_aa0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_aa8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f38 = *puVar11;
    lStack_f30 = plVar7[3];
    local_f48 = &local_f38;
  }
  else {
    local_f38 = *puVar11;
    local_f48 = (ulong *)*plVar7;
  }
  local_f40 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_9e8 = local_9d8;
  std::__cxx11::string::_M_construct((ulong)&local_9e8,'\t');
  uVar17 = 0xf;
  if (local_f48 != &local_f38) {
    uVar17 = local_f38;
  }
  if (uVar17 < (ulong)(local_9e0 + local_f40)) {
    uVar17 = 0xf;
    if (local_9e8 != local_9d8) {
      uVar17 = local_9d8[0];
    }
    if (uVar17 < (ulong)(local_9e0 + local_f40)) goto LAB_001d25b8;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9e8,0,(char *)0x0,(ulong)local_f48);
  }
  else {
LAB_001d25b8:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f48,(ulong)local_9e8);
  }
  local_a88 = &local_a78;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_a78 = *puVar14;
    uStack_a70 = puVar9[3];
  }
  else {
    local_a78 = *puVar14;
    local_a88 = (undefined8 *)*puVar9;
  }
  local_a80 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a88);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f18 = *puVar11;
    lStack_f10 = plVar7[3];
    local_f28 = &local_f18;
  }
  else {
    local_f18 = *puVar11;
    local_f28 = (ulong *)*plVar7;
  }
  local_f20 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_a08 = local_9f8;
  std::__cxx11::string::_M_construct((ulong)&local_a08,'\t');
  uVar17 = 0xf;
  if (local_f28 != &local_f18) {
    uVar17 = local_f18;
  }
  if (uVar17 < (ulong)(local_a00 + local_f20)) {
    uVar17 = 0xf;
    if (local_a08 != local_9f8) {
      uVar17 = local_9f8[0];
    }
    if (uVar17 < (ulong)(local_a00 + local_f20)) goto LAB_001d2705;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a08,0,(char *)0x0,(ulong)local_f28);
  }
  else {
LAB_001d2705:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f28,(ulong)local_a08);
  }
  local_a68 = &local_a58;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_a58 = *puVar14;
    uStack_a50 = puVar9[3];
  }
  else {
    local_a58 = *puVar14;
    local_a68 = (undefined8 *)*puVar9;
  }
  local_a60 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a68);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1498 = *puVar11;
    lStack_1490 = plVar7[3];
    local_14a8 = &local_1498;
  }
  else {
    local_1498 = *puVar11;
    local_14a8 = (ulong *)*plVar7;
  }
  local_14a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_a28 = local_a18;
  std::__cxx11::string::_M_construct((ulong)&local_a28,'\f');
  uVar17 = 0xf;
  if (local_14a8 != &local_1498) {
    uVar17 = local_1498;
  }
  if (uVar17 < (ulong)(local_a20 + local_14a0)) {
    uVar17 = 0xf;
    if (local_a28 != local_a18) {
      uVar17 = local_a18[0];
    }
    if (uVar17 < (ulong)(local_a20 + local_14a0)) goto LAB_001d2852;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a28,0,(char *)0x0,(ulong)local_14a8);
  }
  else {
LAB_001d2852:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_14a8,(ulong)local_a28);
  }
  local_1488 = &local_1478;
  puVar11 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar11) {
    local_1478 = *puVar11;
    uStack_1470 = puVar9[3];
  }
  else {
    local_1478 = *puVar11;
    local_1488 = (ulong *)*puVar9;
  }
  local_1480 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1488);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_13e0 = *puVar11;
    lStack_13d8 = plVar7[3];
    local_13f0 = &local_13e0;
  }
  else {
    local_13e0 = *puVar11;
    local_13f0 = (ulong *)*plVar7;
  }
  local_13e8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_a48 = local_a38;
  std::__cxx11::string::_M_construct((ulong)&local_a48,'\t');
  uVar17 = 0xf;
  if (local_13f0 != &local_13e0) {
    uVar17 = local_13e0;
  }
  if (uVar17 < (ulong)(local_a40 + local_13e8)) {
    uVar17 = 0xf;
    if (local_a48 != local_a38) {
      uVar17 = local_a38[0];
    }
    if (uVar17 < (ulong)(local_a40 + local_13e8)) goto LAB_001d29a0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a48,0,(char *)0x0,(ulong)local_13f0);
  }
  else {
LAB_001d29a0:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_13f0,(ulong)local_a48);
  }
  local_1468 = &local_1458;
  puVar11 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar11) {
    local_1458 = *puVar11;
    uStack_1450 = puVar9[3];
  }
  else {
    local_1458 = *puVar11;
    local_1468 = (ulong *)*puVar9;
  }
  local_1460 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1468);
  local_1428 = &local_1418;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_1418 = *puVar14;
    uStack_1410 = puVar9[3];
  }
  else {
    local_1418 = *puVar14;
    local_1428 = (undefined8 *)*puVar9;
  }
  local_1420 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1428,(ulong)(gridName->_M_dataplus)._M_p);
  local_1448 = &local_1438;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1438 = *puVar11;
    lStack_1430 = plVar7[3];
  }
  else {
    local_1438 = *puVar11;
    local_1448 = (ulong *)*plVar7;
  }
  local_1440 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1448);
  puVar11 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar11) {
    local_1518 = *puVar11;
    uStack_1510 = puVar9[3];
    local_1528 = &local_1518;
  }
  else {
    local_1518 = *puVar11;
    local_1528 = (ulong *)*puVar9;
  }
  local_1520 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_500 = local_4f0;
  std::__cxx11::string::_M_construct((ulong)&local_500,'\x06');
  uVar17 = 0xf;
  if (local_1528 != &local_1518) {
    uVar17 = local_1518;
  }
  if (uVar17 < (ulong)(local_4f8 + local_1520)) {
    uVar17 = 0xf;
    if (local_500 != local_4f0) {
      uVar17 = local_4f0[0];
    }
    if (uVar17 < (ulong)(local_4f8 + local_1520)) goto LAB_001d2b9d;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_500,0,(char *)0x0,(ulong)local_1528);
  }
  else {
LAB_001d2b9d:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1528,(ulong)local_500);
  }
  local_14c8 = &local_14b8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_14b8 = *puVar14;
    uStack_14b0 = puVar9[3];
  }
  else {
    local_14b8 = *puVar14;
    local_14c8 = (undefined8 *)*puVar9;
  }
  local_14c0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_14c8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_14d8 = *puVar11;
    lStack_14d0 = plVar7[3];
    local_14e8 = &local_14d8;
  }
  else {
    local_14d8 = *puVar11;
    local_14e8 = (ulong *)*plVar7;
  }
  local_14e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_520 = local_510;
  std::__cxx11::string::_M_construct((ulong)&local_520,'\x06');
  uVar17 = 0xf;
  if (local_14e8 != &local_14d8) {
    uVar17 = local_14d8;
  }
  if (uVar17 < (ulong)(local_518 + local_14e0)) {
    uVar17 = 0xf;
    if (local_520 != local_510) {
      uVar17 = local_510[0];
    }
    if (uVar17 < (ulong)(local_518 + local_14e0)) goto LAB_001d2cdd;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_520,0,(char *)0x0,(ulong)local_14e8);
  }
  else {
LAB_001d2cdd:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_14e8,(ulong)local_520);
  }
  local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
  psVar12 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1508.field_2._M_allocated_capacity = *psVar12;
    local_1508.field_2._8_8_ = puVar9[3];
  }
  else {
    local_1508.field_2._M_allocated_capacity = *psVar12;
    local_1508._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_1508._M_string_length = puVar9[1];
  *puVar9 = psVar12;
  puVar9[1] = 0;
  *(undefined1 *)psVar12 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1508);
  puVar11 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar11) {
    local_1540 = *puVar11;
    uStack_1538 = puVar9[3];
    local_1550 = &local_1540;
  }
  else {
    local_1540 = *puVar11;
    local_1550 = (ulong *)*puVar9;
  }
  local_1548 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_540 = local_530;
  std::__cxx11::string::_M_construct((ulong)&local_540,'\x06');
  uVar17 = 0xf;
  if (local_1550 != &local_1540) {
    uVar17 = local_1540;
  }
  if (uVar17 < (ulong)(local_538 + local_1548)) {
    uVar17 = 0xf;
    if (local_540 != local_530) {
      uVar17 = local_530[0];
    }
    if (uVar17 < (ulong)(local_538 + local_1548)) goto LAB_001d2e04;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_540,0,(char *)0x0,(ulong)local_1550);
  }
  else {
LAB_001d2e04:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1550,(ulong)local_540);
  }
  local_3c0 = (char *)&local_3b0;
  pcVar15 = (char *)(puVar9 + 2);
  if ((char *)*puVar9 == pcVar15) {
    local_3b0 = *(undefined8 *)pcVar15;
    uStack_3a8 = puVar9[3];
  }
  else {
    local_3b0 = *(undefined8 *)pcVar15;
    local_3c0 = (char *)*puVar9;
  }
  local_3b8 = puVar9[1];
  *puVar9 = pcVar15;
  puVar9[1] = 0;
  *pcVar15 = '\0';
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  (local_1530->_M_dataplus)._M_p = (pointer)&local_1530->field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    lVar3 = plVar7[3];
    (local_1530->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&local_1530->field_2 + 8) = lVar3;
  }
  else {
    (local_1530->_M_dataplus)._M_p = (pointer)*plVar7;
    (local_1530->field_2)._M_allocated_capacity = *psVar12;
  }
  local_1530->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_3c0 != (char *)&local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_540 != local_530) {
    operator_delete(local_540);
  }
  if (local_1550 != &local_1540) {
    operator_delete(local_1550);
  }
  psVar18 = local_1530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
    operator_delete(local_1508._M_dataplus._M_p);
  }
  if (local_520 != local_510) {
    operator_delete(local_520);
  }
  if (local_14e8 != &local_14d8) {
    operator_delete(local_14e8);
  }
  if (local_14c8 != &local_14b8) {
    operator_delete(local_14c8);
  }
  if (local_500 != local_4f0) {
    operator_delete(local_500);
  }
  if (local_1528 != &local_1518) {
    operator_delete(local_1528);
  }
  if (local_1448 != &local_1438) {
    operator_delete(local_1448);
  }
  if (local_1428 != &local_1418) {
    operator_delete(local_1428);
  }
  if (local_1468 != &local_1458) {
    operator_delete(local_1468);
  }
  if (local_a48 != local_a38) {
    operator_delete(local_a48);
  }
  if (local_13f0 != &local_13e0) {
    operator_delete(local_13f0);
  }
  if (local_1488 != &local_1478) {
    operator_delete(local_1488);
  }
  if (local_a28 != local_a18) {
    operator_delete(local_a28);
  }
  if (local_14a8 != &local_1498) {
    operator_delete(local_14a8);
  }
  if (local_a68 != &local_a58) {
    operator_delete(local_a68);
  }
  if (local_a08 != local_9f8) {
    operator_delete(local_a08);
  }
  if (local_f28 != &local_f18) {
    operator_delete(local_f28);
  }
  if (local_a88 != &local_a78) {
    operator_delete(local_a88);
  }
  if (local_9e8 != local_9d8) {
    operator_delete(local_9e8);
  }
  if (local_f48 != &local_f38) {
    operator_delete(local_f48);
  }
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8);
  }
  if (local_9c8 != local_9b8) {
    operator_delete(local_9c8);
  }
  if (local_f68 != &local_f58) {
    operator_delete(local_f68);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8);
  }
  if (local_9a8 != local_998) {
    operator_delete(local_9a8);
  }
  if (local_f88 != &local_f78) {
    operator_delete(local_f88);
  }
  if (local_ae8 != &local_ad8) {
    operator_delete(local_ae8);
  }
  if (local_988 != local_978) {
    operator_delete(local_988);
  }
  if (local_fa8 != &local_f98) {
    operator_delete(local_fa8);
  }
  if (local_b08 != &local_af8) {
    operator_delete(local_b08);
  }
  if (local_968 != local_958) {
    operator_delete(local_968);
  }
  if (local_fc8 != &local_fb8) {
    operator_delete(local_fc8);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28);
  }
  if (local_948 != local_938) {
    operator_delete(local_948);
  }
  if (local_fe8 != &local_fd8) {
    operator_delete(local_fe8);
  }
  if (local_b48 != &local_b38) {
    operator_delete(local_b48);
  }
  if (local_928 != local_918) {
    operator_delete(local_928);
  }
  if (local_1008 != &local_ff8) {
    operator_delete(local_1008);
  }
  if (local_b68 != &local_b58) {
    operator_delete(local_b68);
  }
  if (local_908 != local_8f8) {
    operator_delete(local_908);
  }
  if (local_1028 != &local_1018) {
    operator_delete(local_1028);
  }
  if (local_b88 != &local_b78) {
    operator_delete(local_b88);
  }
  if (local_8e8 != local_8d8) {
    operator_delete(local_8e8);
  }
  if (local_1048 != &local_1038) {
    operator_delete(local_1048);
  }
  if (local_ba8 != &local_b98) {
    operator_delete(local_ba8);
  }
  if (local_8c8 != local_8b8) {
    operator_delete(local_8c8);
  }
  if (local_1068 != &local_1058) {
    operator_delete(local_1068);
  }
  if (local_bc8 != &local_bb8) {
    operator_delete(local_bc8);
  }
  if (local_8a8 != local_898) {
    operator_delete(local_8a8);
  }
  if (local_1088 != &local_1078) {
    operator_delete(local_1088);
  }
  if (local_be8 != &local_bd8) {
    operator_delete(local_be8);
  }
  if (local_888 != local_878) {
    operator_delete(local_888);
  }
  if (local_10a8 != &local_1098) {
    operator_delete(local_10a8);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_c08 != &local_bf8) {
    operator_delete(local_c08);
  }
  if (local_868 != local_858) {
    operator_delete(local_868);
  }
  if (local_10c8 != &local_10b8) {
    operator_delete(local_10c8);
  }
  if (local_c28 != &local_c18) {
    operator_delete(local_c28);
  }
  if (local_848 != local_838) {
    operator_delete(local_848);
  }
  if (local_10e8 != &local_10d8) {
    operator_delete(local_10e8);
  }
  if (local_c48 != &local_c38) {
    operator_delete(local_c48);
  }
  if (local_828 != local_818) {
    operator_delete(local_828);
  }
  if (local_1108 != &local_10f8) {
    operator_delete(local_1108);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_c68 != &local_c58) {
    operator_delete(local_c68);
  }
  if (local_808 != local_7f8) {
    operator_delete(local_808);
  }
  if (local_1128 != &local_1118) {
    operator_delete(local_1128);
  }
  if (local_c88 != &local_c78) {
    operator_delete(local_c88);
  }
  if (local_7e8 != local_7d8) {
    operator_delete(local_7e8);
  }
  if (local_1148 != &local_1138) {
    operator_delete(local_1148);
  }
  if (local_ca8 != &local_c98) {
    operator_delete(local_ca8);
  }
  if (local_7c8 != local_7b8) {
    operator_delete(local_7c8);
  }
  if (local_1168 != &local_1158) {
    operator_delete(local_1168);
  }
  if (local_cc8 != &local_cb8) {
    operator_delete(local_cc8);
  }
  if (local_7a8 != local_798) {
    operator_delete(local_7a8);
  }
  if (local_1188 != &local_1178) {
    operator_delete(local_1188);
  }
  if (local_ce8 != &local_cd8) {
    operator_delete(local_ce8);
  }
  if (local_788 != local_778) {
    operator_delete(local_788);
  }
  if (local_11a8 != &local_1198) {
    operator_delete(local_11a8);
  }
  if (local_d08 != &local_cf8) {
    operator_delete(local_d08);
  }
  if (local_768 != local_758) {
    operator_delete(local_768);
  }
  if (local_11c8 != &local_11b8) {
    operator_delete(local_11c8);
  }
  if (local_d28 != &local_d18) {
    operator_delete(local_d28);
  }
  if (local_748 != local_738) {
    operator_delete(local_748);
  }
  if (local_11e8 != &local_11d8) {
    operator_delete(local_11e8);
  }
  if (local_d48 != &local_d38) {
    operator_delete(local_d48);
  }
  if (local_728 != local_718) {
    operator_delete(local_728);
  }
  if (local_1208 != &local_11f8) {
    operator_delete(local_1208);
  }
  if (local_d68 != &local_d58) {
    operator_delete(local_d68);
  }
  if (local_708 != local_6f8) {
    operator_delete(local_708);
  }
  if (local_1228 != &local_1218) {
    operator_delete(local_1228);
  }
  if (local_d88 != &local_d78) {
    operator_delete(local_d88);
  }
  if (local_6e8 != local_6d8) {
    operator_delete(local_6e8);
  }
  if (local_1248 != &local_1238) {
    operator_delete(local_1248);
  }
  if (local_da8 != &local_d98) {
    operator_delete(local_da8);
  }
  if (local_6c8 != local_6b8) {
    operator_delete(local_6c8);
  }
  if (local_1268 != &local_1258) {
    operator_delete(local_1268);
  }
  if (local_dc8 != &local_db8) {
    operator_delete(local_dc8);
  }
  if (local_6a8 != local_698) {
    operator_delete(local_6a8);
  }
  if (local_1288 != &local_1278) {
    operator_delete(local_1288);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_de8 != &local_dd8) {
    operator_delete(local_de8);
  }
  if (local_688 != local_678) {
    operator_delete(local_688);
  }
  if (local_12a8 != &local_1298) {
    operator_delete(local_12a8);
  }
  if (local_e08 != &local_df8) {
    operator_delete(local_e08);
  }
  if (local_668 != local_658) {
    operator_delete(local_668);
  }
  if (local_12c8 != &local_12b8) {
    operator_delete(local_12c8);
  }
  if (local_e28 != &local_e18) {
    operator_delete(local_e28);
  }
  if (local_648 != local_638) {
    operator_delete(local_648);
  }
  if (local_12e8 != &local_12d8) {
    operator_delete(local_12e8);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_e48 != &local_e38) {
    operator_delete(local_e48);
  }
  if (local_628 != local_618) {
    operator_delete(local_628);
  }
  if (local_1308 != &local_12f8) {
    operator_delete(local_1308);
  }
  if (local_e68 != &local_e58) {
    operator_delete(local_e68);
  }
  if (local_608 != local_5f8) {
    operator_delete(local_608);
  }
  if (local_1328 != &local_1318) {
    operator_delete(local_1328);
  }
  if (local_e88 != &local_e78) {
    operator_delete(local_e88);
  }
  if (local_5e8 != local_5d8) {
    operator_delete(local_5e8);
  }
  if (local_1348 != &local_1338) {
    operator_delete(local_1348);
  }
  if (local_ea8 != &local_e98) {
    operator_delete(local_ea8);
  }
  if (local_5c8 != local_5b8) {
    operator_delete(local_5c8);
  }
  if (local_1368 != &local_1358) {
    operator_delete(local_1368);
  }
  if (local_ec8 != &local_eb8) {
    operator_delete(local_ec8);
  }
  if (local_5a8 != local_598) {
    operator_delete(local_5a8);
  }
  if (local_1388 != &local_1378) {
    operator_delete(local_1388);
  }
  if (local_ee8 != &local_ed8) {
    operator_delete(local_ee8);
  }
  if (local_588 != local_578) {
    operator_delete(local_588);
  }
  if (local_13a8 != &local_1398) {
    operator_delete(local_13a8);
  }
  if (local_f08 != &local_ef8) {
    operator_delete(local_f08);
  }
  if (local_568 != local_558) {
    operator_delete(local_568);
  }
  if (local_13c8 != &local_13b8) {
    operator_delete(local_13c8);
  }
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0]);
  }
LAB_001d460c:
  std::ifstream::~ifstream(local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1408);
  return psVar18;
}

Assistant:

std::string KMeans::genClusterInitialization(const std::string& gridName)
{
    std::vector<std::string> initList;

    /* Load the cluster initialization file into an input stream. */
    ifstream input(multifaq::dir::PATH_TO_FILES + "/cluster_init.conf");

    std::cout << "INFO: Looking for cluster initialization file: " << multifaq::dir::PATH_TO_FILES + "/cluster_init.conf" << std::endl;

    if (!input)
    {
        std::cout << "INFO: No cluster initialization file provided. \n";
        std::cout << "INFO: We will use Kmeans++ Initialization instead. \n";
        
        return offset(2)+"// Initialize the means\n\n"+
            offset(2)+"std::srand (time(NULL));\n\n"+
	  offset(2)+"double randomVal = (double)(rand() % (size_t)size_of_query_result);\n"+
	  offset(2)+"double count = 0.0;\n"+
	  offset(2)+"size_t pos = 0;\n"+
	  offset(2)+"while (randomVal < count)\n"+
	  offset(2)+"{\n"+
	  offset(3)+"count += "+gridName+"[pos].aggregates[0];\n"+
	  offset(3)+"++pos;\n"+
	  offset(2)+"}\n"+
	  offset(2)+"means[0] = "+gridName+"[pos];\n"+
            // offset(2)+"means[0] = "+gridName+"[rand() % grid_size];\n\n"+
            offset(2)+"std::vector<double> distribution(grid_size,0.0);\n"+
            offset(2)+"for (size_t i = 1; i < k; ++i)\n"+offset(2)+"{\n"+
            offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n"+
            offset(3)+"double dist_sum = 0.0;\n"+
	  offset(3)+"#pragma omp parallel for num_threads(32) private(min_dist,dist) shared(distribution) reduction(+:dist_sum)\n"+
            offset(3)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+
            offset(3)+"{\n"+
            offset(4)+"min_dist = std::numeric_limits<double>::max();\n"+
            offset(4)+"for (size_t cluster = 0; cluster < i; ++cluster)\n"+
            offset(4)+"{\n"+
            offset(5)+"distance(dist, "+gridName+
            "[tup], means[cluster], cluster, &distance_to_mean[0]);\n"+
            offset(5)+"min_dist = std::min(dist, min_dist);\n"+
            offset(4)+"}\n"+
            offset(4)+"min_dist *= "+gridName+"[tup].aggregates[0];\n"+
            offset(4)+"distribution[tup] = min_dist;\n"+
            offset(4)+"dist_sum += min_dist;\n"+
            offset(3)+"}\n"+
            offset(3)+"distribution[0] /= dist_sum;\n"+
            offset(3)+"for (size_t tup = 1; tup < grid_size; ++tup)\n"+
            offset(3)+"{\n"+
            offset(4)+"distribution[tup] /= dist_sum;\n"+
            offset(4)+"distribution[tup] += distribution[tup-1];\n"+
            offset(3)+"}\n\n"+
            offset(3)+"// Sample a point...\n"+
            offset(3)+"const double sampleValue = ((double) rand() / (RAND_MAX));\n"+
            offset(3)+"size_t pos = 0;\n"+
            offset(3)+"while (distribution[pos] < sampleValue)\n"+
            offset(4)+"pos++;\n"+
            offset(3)+"means[i] = "+gridName+"[pos];\n"+
            offset(2)+"}\n"+
	  offset(2)+"int64_t endInit = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count()-startProcess;\n"+
	  offset(2)+"startProcess = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();\n";
    }
    else
    {
        /* String and associated stream to receive lines from the file. */
        string line;
        stringstream ssLine;

        while (std::getline(input, line))
        {
            if (line[0] == COMMENT_CHAR)
            {
                continue;
            }
            initList.push_back(line+"\n");
        }
    }

    std::string returnString = offset(2)+"// Initialize the means\n";
    
    for (size_t str = 0; str < std::min(initList.size(), _k); ++str)
    {
        returnString += offset(2)+"means["+std::to_string(str)+"] = "+
            initList[str];
    }
    
    if (initList.size() < _k)
    {
        returnString += offset(2)+"for (size_t cluster = "+
            std::to_string(initList.size())+"; cluster < k; ++cluster)\n"+
            offset(3)+"means[cluster] += "+gridName+"[rand() % "+
            gridName+".size()];\n\n";
    }
    
    return returnString;
}